

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

art_iterator_t * art_upper_bound(art_t *art,art_key_chunk_t *key)

{
  _Bool _Var1;
  int iVar2;
  art_t *in_RSI;
  art_iterator_t *in_RDI;
  art_key_chunk_t *in_stack_00000008;
  art_iterator_t *iterator;
  art_key_chunk_t *in_stack_ffffffffffffffd8;
  art_iterator_t *key1;
  
  key1 = in_RDI;
  memset(in_RDI,0,0x90);
  in_RDI->art = in_RSI;
  if (((in_RSI->root != 0) &&
      (_Var1 = art_node_iterator_lower_bound((art_ref_t)key,iterator,in_stack_00000008), _Var1)) &&
     (iVar2 = art_compare_keys(key1->key,in_stack_ffffffffffffffd8), iVar2 == 0)) {
    art_iterator_next((art_iterator_t *)0x10980b);
  }
  return key1;
}

Assistant:

art_iterator_t art_upper_bound(art_t *art, const art_key_chunk_t *key) {
    art_iterator_t iterator = CROARING_ZERO_INITIALIZER;
    iterator.art = art;
    if (art->root != CROARING_ART_NULL_REF) {
        if (art_node_iterator_lower_bound(art->root, &iterator, key) &&
            art_compare_keys(iterator.key, key) == 0) {
            art_iterator_next(&iterator);
        }
    }
    return iterator;
}